

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

char RegexTree::parse_control(char ch)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,ch);
  switch(iVar1) {
  case 0x28:
    iVar1 = 0x11;
    break;
  case 0x29:
  case 0x2c:
  case 0x2d:
    break;
  case 0x2a:
    return '\t';
  case 0x2b:
    return '\v';
  case 0x2e:
    return '\x10';
  default:
    if (iVar1 == 0x3f) {
      return '\f';
    }
    if (iVar1 == 0x7c) {
      return '\n';
    }
  }
  return (char)iVar1;
}

Assistant:

char RegexTree::parse_control(char ch) {
    switch (ch) {
        case '*':
            return STAR;
        case '+':
            return PLUS;
        case '?':
            return QUESTION;
        case '(':
            return BLOCK;
        case '|':
            return OR;
        case '.':
            return WILDCARD;
        default:
            return ch;
    }
}